

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaPIllegalFacetListUnionErr
               (xmlSchemaParserCtxtPtr ctxt,xmlParserErrors error,xmlSchemaTypePtr type,
               xmlSchemaFacetPtr facet)

{
  xmlNodePtr node;
  xmlChar *str1;
  xmlChar *str2;
  char *in_R8;
  int in_R9D;
  int in_stack_ffffffffffffffa0;
  xmlChar *local_38;
  
  local_38 = (xmlChar *)0x0;
  xmlSchemaFormatItemForReport
            (&local_38,(xmlChar *)type,(xmlSchemaBasicItemPtr)type->node,(xmlNodePtr)facet);
  str1 = local_38;
  node = type->node;
  str2 = xmlSchemaFacetTypeToString(facet->type);
  xmlSchemaPErrFull(ctxt,node,error,XML_ERR_ERROR,in_R8,in_R9D,str1,str2,(xmlChar *)0x0,
                    in_stack_ffffffffffffffa0,"%s: The facet \'%s\' is not allowed.\n",str1,str2);
  if (local_38 != (xmlChar *)0x0) {
    (*xmlFree)(local_38);
  }
  return;
}

Assistant:

static void
xmlSchemaPIllegalFacetListUnionErr(xmlSchemaParserCtxtPtr ctxt,
			  xmlParserErrors error,
			  xmlSchemaTypePtr type,
			  xmlSchemaFacetPtr facet)
{
    xmlChar *des = NULL;

    xmlSchemaFormatItemForReport(&des, NULL, WXS_BASIC_CAST type,
	type->node);
    xmlSchemaPErr(ctxt, type->node, error,
	"%s: The facet '%s' is not allowed.\n",
	BAD_CAST des, xmlSchemaFacetTypeToString(facet->type));
    FREE_AND_NULL(des);
}